

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.cc
# Opt level: O0

bool re2::parse_double_float(char *str,size_t n,bool isfloat,void *dest)

{
  char *__nptr;
  int *piVar1;
  double *in_RCX;
  byte in_DL;
  long in_RSI;
  float fVar2;
  double r;
  char *end;
  char buf [201];
  double local_108;
  char *local_100;
  bool in_stack_ffffffffffffff0f;
  size_t *in_stack_ffffffffffffff10;
  char *in_stack_ffffffffffffff18;
  size_t in_stack_ffffffffffffff20;
  char *in_stack_ffffffffffffff28;
  bool local_1;
  
  if (in_RSI == 0) {
    local_1 = false;
  }
  else {
    __nptr = TerminateNumber(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
                             in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                             in_stack_ffffffffffffff0f);
    piVar1 = __errno_location();
    *piVar1 = 0;
    if ((in_DL & 1) == 0) {
      local_108 = strtod(__nptr,&local_100);
    }
    else {
      fVar2 = strtof(__nptr,&local_100);
      local_108 = (double)fVar2;
    }
    if (local_100 == __nptr + in_RSI) {
      piVar1 = __errno_location();
      if (*piVar1 == 0) {
        if (in_RCX == (double *)0x0) {
          local_1 = true;
        }
        else {
          if ((in_DL & 1) == 0) {
            *in_RCX = local_108;
          }
          else {
            *(float *)in_RCX = (float)local_108;
          }
          local_1 = true;
        }
      }
      else {
        local_1 = false;
      }
    }
    else {
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

static bool parse_double_float(const char* str, size_t n, bool isfloat,
                               void* dest) {
  if (n == 0) return false;
  static const int kMaxLength = 200;
  char buf[kMaxLength+1];
  str = TerminateNumber(buf, sizeof buf, str, &n, true);
  char* end;
  errno = 0;
  double r;
  if (isfloat) {
    r = strtof(str, &end);
  } else {
    r = strtod(str, &end);
  }
  if (end != str + n) return false;   // Leftover junk
  if (errno) return false;
  if (dest == NULL) return true;
  if (isfloat) {
    *(reinterpret_cast<float*>(dest)) = (float)r;
  } else {
    *(reinterpret_cast<double*>(dest)) = r;
  }
  return true;
}